

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall TPZTensor<double>::TPZTensor(TPZTensor<double> *this,TPZDecomposed *eigensystem)

{
  TPZTensor<double> *constant;
  uint *puVar1;
  long in_RSI;
  TPZTensor<double> *in_RDI;
  uint i;
  TPZTensor<double> *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffdc;
  TPZManVector<double,_6> *in_stack_ffffffffffffffe0;
  
  TPZSavable::TPZSavable(&in_RDI->super_TPZSavable,&PTR_PTR_02438dc0);
  (in_RDI->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_02438d70;
  this_00 = (TPZTensor<double> *)&in_RDI->fData;
  TPZManVector<double,_6>::TPZManVector
            (in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
             ,(double *)this_00);
  for (uVar2 = 0; uVar2 < 3; uVar2 = *puVar1 + uVar2) {
    constant = TPZVec<TPZTensor<double>_>::operator[]
                         ((TPZVec<TPZTensor<double>_> *)(in_RSI + 0x138),(ulong)uVar2);
    TPZVec<double>::operator[]((TPZVec<double> *)(in_RSI + 0x38),(ulong)uVar2);
    Add<double,double>(this_00,in_RDI,(double *)constant);
    puVar1 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 8),(ulong)uVar2);
  }
  return;
}

Assistant:

TPZTensor(const TPZDecomposed &eigensystem) : fData(6, T(0.)) {
        unsigned int i;
        for (i = 0; i < 3; i += eigensystem.fGeometricMultiplicity[i]) {
            Add(eigensystem.fEigentensors[i], eigensystem.fEigenvalues[i]);
        }
#ifdef PZDEBUG
        if (i != 3) {
            DebugStop();
        }
#endif
    }